

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void unqlitePagerRandomString(Pager *pPager,char *zBuf,sxu32 nLen)

{
  uint local_20;
  sxu32 i;
  sxu32 nLen_local;
  char *zBuf_local;
  Pager *pPager_local;
  
  SyRandomness(&pPager->sPrng,zBuf,nLen);
  for (local_20 = 0; local_20 < nLen; local_20 = local_20 + 1) {
    zBuf[local_20] = "abcdefghijklmnopqrstuvwxyz"[(ulong)(long)zBuf[local_20] % 0x1a];
  }
  return;
}

Assistant:

UNQLITE_PRIVATE void unqlitePagerRandomString(Pager *pPager,char *zBuf,sxu32 nLen)
{
	static const char zBase[] = {"abcdefghijklmnopqrstuvwxyz"}; /* English Alphabet */
	sxu32 i;
	/* Generate a binary string first */
	SyRandomness(&pPager->sPrng,zBuf,nLen);
	/* Turn the binary string into english based alphabet */
	for( i = 0 ; i < nLen ; ++i ){
		 zBuf[i] = zBase[zBuf[i] % (sizeof(zBase)-1)];
	 }
}